

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_dbl_scanfn(arg_dbl *parent,char *argval)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  char *end;
  
  uVar1 = parent->count;
  end = (char *)(ulong)uVar1;
  if (uVar1 == (parent->hdr).maxcount) {
    return 2;
  }
  if (argval == (char *)0x0) {
    parent->count = uVar1 + 1;
  }
  else {
    dVar3 = strtod(argval,&end);
    if (*end != '\0') {
      return 5;
    }
    iVar2 = parent->count;
    parent->count = iVar2 + 1;
    parent->dval[iVar2] = dVar3;
  }
  return 0;
}

Assistant:

static int arg_dbl_scanfn(struct arg_dbl * parent, const char * argval) {
	int errorcode = 0;

	if (parent->count == parent->hdr.maxcount) {
		/* maximum number of arguments exceeded */
		errorcode = EMAXCOUNT;
	} else if (!argval) {
		/* a valid argument with no argument value was given. */
		/* This happens when an optional argument value was invoked. */
		/* leave parent argument value unaltered but still count the argument. */
		parent->count++;
	} else {
		double val;
		char * end;

		/* extract double from argval into val */
		val = strtod(argval, &end);

		/* if success then store result in parent->dval[] array otherwise return error*/
		if (*end == 0) {
			parent->dval[parent->count++] = val;
		} else {
			errorcode = EBADDOUBLE;
		}
	}

	ARG_TRACE(("%s:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
	return errorcode;
}